

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mathCoreCompare.cpp
# Opt level: O2

bool mathCore::same_sign(expression *a,expression *b)

{
  uint uVar1;
  
  if (((a->FLAGS & 2U) != 0) && (uVar1 = b->FLAGS, (uVar1 & 2) != 0)) {
    if ((a->FLAGS & 4U) == 0) {
      return (uVar1 & 4) == 0;
    }
    return SUB41((uVar1 & 4) >> 2,0);
  }
  return false;
}

Assistant:

bool mathCore::is_var(expression* a) {
	return a->FLAGS & F_VAR;
}